

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx_mdef_convert.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *filename;
  bool bVar1;
  int iVar2;
  bin_mdef_t *pbVar3;
  char *pcVar4;
  char *__format;
  
  if (argc - 5U < 0xfffffffe) {
    main_cold_2();
  }
  else {
    pcVar4 = argv[1];
    if (*pcVar4 == '-') {
      argv = argv + 1;
      iVar2 = strcmp(pcVar4,"-text");
      if (iVar2 == 0) {
        bVar1 = true;
      }
      else {
        iVar2 = strcmp(pcVar4,"-bin");
        if (iVar2 != 0) {
          main_cold_1();
          return 1;
        }
        bVar1 = false;
      }
    }
    else {
      bVar1 = false;
    }
    pcVar4 = argv[1];
    filename = argv[2];
    if (bVar1) {
      pbVar3 = bin_mdef_read((ps_config_t *)0x0,pcVar4);
      if (pbVar3 == (bin_mdef_t *)0x0) {
        __format = "Failed to read binary mdef from %s\n";
      }
      else {
        iVar2 = bin_mdef_write_text(pbVar3,filename);
        if (-1 < iVar2) {
          return 0;
        }
        __format = "Failed to write text mdef to %s\n";
        pcVar4 = filename;
      }
    }
    else {
      pbVar3 = bin_mdef_read_text((ps_config_t *)0x0,pcVar4);
      if (pbVar3 == (bin_mdef_t *)0x0) {
        __format = "Failed to read text mdef from %s\n";
      }
      else {
        iVar2 = bin_mdef_write(pbVar3,filename);
        if (-1 < iVar2) {
          return 0;
        }
        __format = "Failed to write binary mdef to %s\n";
        pcVar4 = filename;
      }
    }
    fprintf(_stderr,__format,pcVar4);
  }
  return 1;
}

Assistant:

int
main(int argc, char *argv[])
{
    const char *infile, *outfile;
    bin_mdef_t *bin;
    int tobin = 1;

    if (argc < 3 || argc > 4) {
        fprintf(stderr, "Usage: %s [-text | -bin] INPUT OUTPUT\n",
                argv[0]);
        return 1;
    }
    if (argv[1][0] == '-') {
        if (strcmp(argv[1], "-text") == 0) {
            tobin = 0;
            ++argv;
        }
        else if (strcmp(argv[1], "-bin") == 0) {
            tobin = 1;
            ++argv;
        }
        else {
            fprintf(stderr, "Unknown argument %s\n", argv[1]);
            fprintf(stderr, "Usage: %s [-text | -bin] INPUT OUTPUT\n",
                    argv[0]);
            return 1;
        }
    }
    infile = argv[1];
    outfile = argv[2];

    if (tobin) {
        if ((bin = bin_mdef_read_text(NULL, infile)) == NULL) {
            fprintf(stderr, "Failed to read text mdef from %s\n", infile);
            return 1;
        }
        if (bin_mdef_write(bin, outfile) < 0) {
            fprintf(stderr, "Failed to write binary mdef to %s\n",
                    outfile);
            return 1;
        }
    }
    else {
        if ((bin = bin_mdef_read(NULL, infile)) == NULL) {
            fprintf(stderr, "Failed to read binary mdef from %s\n",
                    infile);
            return 1;
        }
        if (bin_mdef_write_text(bin, outfile) < 0) {
            fprintf(stderr, "Failed to write text mdef to %s\n", outfile);
            return 1;
        }
    }

    return 0;
}